

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AeronArchive.cpp
# Opt level: O2

int64_t __thiscall
aeron::archive::AeronArchive::pollForResponse(AeronArchive *this,int64_t correlationId)

{
  Value __val;
  long lVar1;
  int64_t iVar2;
  string *__rhs;
  ArchiveException *pAVar3;
  char *pcVar4;
  allocator local_152;
  allocator local_151;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_150;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_130;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_110;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  string local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  deadline;
  string local_88;
  string local_68;
  string local_48;
  
  lVar1 = std::chrono::_V2::system_clock::now();
  deadline.__d.__r = (duration)(lVar1 + (this->messageTimeoutNs_).__r);
  do {
    while( true ) {
      pollNextResponse(this,correlationId,&deadline);
      iVar2 = ControlResponsePoller::controlSessionId
                        ((this->controlResponsePoller_)._M_t.
                         super___uniq_ptr_impl<aeron::archive::ControlResponsePoller,_std::default_delete<aeron::archive::ControlResponsePoller>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_aeron::archive::ControlResponsePoller_*,_std::default_delete<aeron::archive::ControlResponsePoller>_>
                         .super__Head_base<0UL,_aeron::archive::ControlResponsePoller_*,_false>.
                         _M_head_impl);
      if (iVar2 == this->controlSessionId_) break;
LAB_0013c893:
      concurrent::AgentInvoker<aeron::ClientConductor>::invoke
                (&((this->aeron_).super___shared_ptr<aeron::Aeron,_(__gnu_cxx::_Lock_policy)2>.
                  _M_ptr)->m_conductorInvoker);
    }
    iVar2 = ControlResponsePoller::templateId
                      ((this->controlResponsePoller_)._M_t.
                       super___uniq_ptr_impl<aeron::archive::ControlResponsePoller,_std::default_delete<aeron::archive::ControlResponsePoller>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_aeron::archive::ControlResponsePoller_*,_std::default_delete<aeron::archive::ControlResponsePoller>_>
                       .super__Head_base<0UL,_aeron::archive::ControlResponsePoller_*,_false>.
                       _M_head_impl);
    if (iVar2 != 1) goto LAB_0013c893;
    __val = ControlResponsePoller::code
                      ((this->controlResponsePoller_)._M_t.
                       super___uniq_ptr_impl<aeron::archive::ControlResponsePoller,_std::default_delete<aeron::archive::ControlResponsePoller>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_aeron::archive::ControlResponsePoller_*,_std::default_delete<aeron::archive::ControlResponsePoller>_>
                       .super__Head_base<0UL,_aeron::archive::ControlResponsePoller_*,_false>.
                       _M_head_impl);
    if (__val == ERROR) {
      pAVar3 = (ArchiveException *)__cxa_allocate_exception(0x48);
      std::__cxx11::to_string(&local_d0,correlationId);
      std::operator+(&local_b0,"response for correlation id: ",&local_d0);
      std::operator+(&local_150,&local_b0,", error: ");
      __rhs = ControlResponsePoller::errorMessage_abi_cxx11_
                        ((this->controlResponsePoller_)._M_t.
                         super___uniq_ptr_impl<aeron::archive::ControlResponsePoller,_std::default_delete<aeron::archive::ControlResponsePoller>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_aeron::archive::ControlResponsePoller_*,_std::default_delete<aeron::archive::ControlResponsePoller>_>
                         .super__Head_base<0UL,_aeron::archive::ControlResponsePoller_*,_false>.
                         _M_head_impl);
      std::operator+(&local_130,&local_150,__rhs);
      std::operator+(&local_110,&local_130,", relevant id: ");
      iVar2 = ControlResponsePoller::relevantId
                        ((this->controlResponsePoller_)._M_t.
                         super___uniq_ptr_impl<aeron::archive::ControlResponsePoller,_std::default_delete<aeron::archive::ControlResponsePoller>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_aeron::archive::ControlResponsePoller_*,_std::default_delete<aeron::archive::ControlResponsePoller>_>
                         .super__Head_base<0UL,_aeron::archive::ControlResponsePoller_*,_false>.
                         _M_head_impl);
      std::__cxx11::to_string(&local_48,iVar2);
      std::operator+(&local_f0,&local_110,&local_48);
      std::__cxx11::string::string
                ((string *)&local_68,
                 "std::int64_t aeron::archive::AeronArchive::pollForResponse(std::int64_t)",
                 &local_151);
      pcVar4 = aeron::util::past_prefix
                         ("/workspace/llm4binary/github/license_all_cmakelists_1510/fairtide[P]aeron-archive-client"
                          ,
                          "/workspace/llm4binary/github/license_all_cmakelists_1510/fairtide[P]aeron-archive-client/src/AeronArchive.cpp"
                         );
      std::__cxx11::string::string((string *)&local_88,pcVar4,&local_152);
      ArchiveException::ArchiveException(pAVar3,&local_f0,&local_68,&local_88,0x170);
      __cxa_throw(pAVar3,&ArchiveException::typeinfo,
                  aeron::util::SourcedException::~SourcedException);
    }
    iVar2 = ControlResponsePoller::correlationId
                      ((this->controlResponsePoller_)._M_t.
                       super___uniq_ptr_impl<aeron::archive::ControlResponsePoller,_std::default_delete<aeron::archive::ControlResponsePoller>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_aeron::archive::ControlResponsePoller_*,_std::default_delete<aeron::archive::ControlResponsePoller>_>
                       .super__Head_base<0UL,_aeron::archive::ControlResponsePoller_*,_false>.
                       _M_head_impl);
    if (iVar2 == correlationId) {
      if (__val == OK) {
        iVar2 = ControlResponsePoller::relevantId
                          ((this->controlResponsePoller_)._M_t.
                           super___uniq_ptr_impl<aeron::archive::ControlResponsePoller,_std::default_delete<aeron::archive::ControlResponsePoller>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_aeron::archive::ControlResponsePoller_*,_std::default_delete<aeron::archive::ControlResponsePoller>_>
                           .super__Head_base<0UL,_aeron::archive::ControlResponsePoller_*,_false>.
                           _M_head_impl);
        return iVar2;
      }
      pAVar3 = (ArchiveException *)__cxa_allocate_exception(0x48);
      std::__cxx11::to_string(&local_110,__val);
      std::operator+(&local_f0,"unexpected response: code=",&local_110);
      std::__cxx11::string::string
                ((string *)&local_130,
                 "std::int64_t aeron::archive::AeronArchive::pollForResponse(std::int64_t)",
                 (allocator *)&local_b0);
      pcVar4 = aeron::util::past_prefix
                         ("/workspace/llm4binary/github/license_all_cmakelists_1510/fairtide[P]aeron-archive-client"
                          ,
                          "/workspace/llm4binary/github/license_all_cmakelists_1510/fairtide[P]aeron-archive-client/src/AeronArchive.cpp"
                         );
      std::__cxx11::string::string((string *)&local_150,pcVar4,(allocator *)&local_d0);
      ArchiveException::ArchiveException(pAVar3,&local_f0,&local_130,&local_150,0x173);
      __cxa_throw(pAVar3,&ArchiveException::typeinfo,
                  aeron::util::SourcedException::~SourcedException);
    }
  } while( true );
}

Assistant:

std::int64_t AeronArchive::pollForResponse(std::int64_t correlationId) {
    auto deadline = Clock::now() + messageTimeoutNs_;

    while (true) {
        pollNextResponse(correlationId, deadline);

        if (controlResponsePoller_->controlSessionId() != controlSessionId_ ||
            controlResponsePoller_->templateId() != codecs::ControlResponse::sbeTemplateId()) {
            aeron_->conductorAgentInvoker().invoke();
            continue;
        }

        auto code = controlResponsePoller_->code();
        if (code == codecs::ControlResponseCode::ERROR) {
            throw ArchiveException("response for correlation id: " + std::to_string(correlationId) +
                                       ", error: " + controlResponsePoller_->errorMessage() +
                                       ", relevant id: " + std::to_string(controlResponsePoller_->relevantId()),
                                   SOURCEINFO);
        } else if (correlationId == controlResponsePoller_->correlationId()) {
            if (code != codecs::ControlResponseCode::OK) {
                throw ArchiveException("unexpected response: code=" + std::to_string(code), SOURCEINFO);
            }

            return controlResponsePoller_->relevantId();
        }
    }
}